

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O2

vector<ROM::Description,_std::allocator<ROM::Description>_> * ROM::all_descriptions(void)

{
  Name name;
  vector<ROM::Description,_std::allocator<ROM::Description>_> *in_RDI;
  Description local_b0;
  
  (in_RDI->super__Vector_base<ROM::Description,_std::allocator<ROM::Description>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->super__Vector_base<ROM::Description,_std::allocator<ROM::Description>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<ROM::Description,_std::allocator<ROM::Description>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (name = AcornBASICII; name != (Vic20SwedishCharacters|AmigaKickstart10);
      name = name + AcornBASICII) {
    Description::Description(&local_b0,name);
    std::vector<ROM::Description,_std::allocator<ROM::Description>_>::emplace_back<ROM::Description>
              (in_RDI,&local_b0);
    Description::~Description(&local_b0);
  }
  return in_RDI;
}

Assistant:

std::vector<Description> ROM::all_descriptions() {
	std::vector<Description> result;
	for(int name = 1; name <= MaxName; name++) {
		result.push_back(Description(ROM::Name(name)));
	}
	return result;
}